

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::EnumDescriptorTest_IsClosed_Test::
EnumDescriptorTest_IsClosed_Test(EnumDescriptorTest_IsClosed_Test *this)

{
  EnumDescriptorTest_IsClosed_Test *this_local;
  
  EnumDescriptorTest::EnumDescriptorTest(&this->super_EnumDescriptorTest);
  (this->super_EnumDescriptorTest).super_Test._vptr_Test =
       (_func_int **)&PTR__EnumDescriptorTest_IsClosed_Test_029a66a0;
  return;
}

Assistant:

TEST_F(EnumDescriptorTest, IsClosed) {
  // enum_ is proto2.
  EXPECT_TRUE(enum_->is_closed());

  // Make a proto3 version of enum_.
  FileDescriptorProto foo_file3;
  foo_file_->CopyTo(&foo_file3);
  foo_file3.set_syntax("proto3");

  // Make this valid proto3 by making the first enum value be zero.
  foo_file3.mutable_enum_type(0)->mutable_value(0)->set_number(0);

  DescriptorPool pool3;
  const EnumDescriptor* enum3 = pool3.BuildFile(foo_file3)->enum_type(0);
  EXPECT_FALSE(enum3->is_closed());
}